

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

bool __thiscall dg::llvmdg::LLVMSlicer::removeBlock(LLVMSlicer *this,LLVMBBlock *block)

{
  bool bVar1;
  KeyT *ppVVar2;
  iterator pred;
  reference blk_00;
  iterator V;
  reference this_00;
  BBlock<dg::LLVMNode> *in_RSI;
  Instruction *Inst;
  iterator __end2_1;
  iterator __begin2_1;
  BasicBlock *__range2_1;
  Value *sval;
  BBlockEdge *succ;
  iterator __end2;
  iterator __begin2;
  SuccContainerT *__range2;
  BasicBlock *blk;
  Value *val;
  BasicBlock *in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *in_stack_ffffffffffffff90;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  in_stack_ffffffffffffffa0;
  _Self local_38;
  SuccContainerT *local_30;
  ret_type local_28;
  KeyT local_20;
  BBlock<dg::LLVMNode> *local_18;
  
  local_18 = in_RSI;
  ppVVar2 = BBlock<dg::LLVMNode>::getKey(in_RSI);
  local_20 = *ppVVar2;
  if (local_20 != (KeyT)0x0) {
    local_28 = llvm::cast<llvm::BasicBlock,llvm::Value>((Value *)0x1abcec);
    local_30 = BBlock<dg::LLVMNode>::successors(local_18);
    local_38._M_node =
         (_Base_ptr)
         DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                   ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    in_stack_ffffffffffffff88);
    pred = DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                     ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                      in_stack_ffffffffffffff88);
    while (bVar1 = std::operator!=(&local_38,(_Self *)&stack0xffffffffffffffc0), bVar1) {
      blk_00 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                         ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1abd3d)
      ;
      if (((blk_00->label != 0xff) && (blk_00->target != local_18)) &&
         (ppVVar2 = BBlock<dg::LLVMNode>::getKey(blk_00->target), *ppVVar2 != (KeyT)0x0)) {
        llvm::cast<llvm::BasicBlock,llvm::Value>((Value *)0x1abd8c);
        adjustPhiNodes((BasicBlock *)pred._M_node,(BasicBlock *)blk_00);
      }
      std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
                (in_stack_ffffffffffffff90);
    }
    dropAllUses<llvm::BasicBlock>((BasicBlock *)in_stack_ffffffffffffffa0.NodePtr);
    V = llvm::BasicBlock::begin(in_stack_ffffffffffffff88);
    local_68.NodePtr = (node_pointer)llvm::BasicBlock::end(in_stack_ffffffffffffff88);
    while (bVar1 = llvm::operator!=((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                     *)&stack0xffffffffffffffa0,&local_68), bVar1) {
      this_00 = llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                             *)0x1abdfb);
      dropAllUses<llvm::Instruction>((Instruction *)V.NodePtr);
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                    *)this_00);
    }
    llvm::BasicBlock::eraseFromParent();
  }
  return true;
}

Assistant:

bool removeBlock(LLVMBBlock *block) override {
        assert(block);

        llvm::Value *val = block->getKey();
        if (val == nullptr)
            return true;

        llvm::BasicBlock *blk = llvm::cast<llvm::BasicBlock>(val);
        for (const auto &succ : block->successors()) {
            if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL)
                continue;

            // don't adjust phi nodes in this block if this is a self-loop,
            // we're gonna remove the block anyway
            if (succ.target == block)
                continue;

            if (llvm::Value *sval = succ.target->getKey())
                adjustPhiNodes(llvm::cast<llvm::BasicBlock>(sval), blk);
        }

        // We need to drop the reference to this block in all
        // braching instructions that jump to this block.
        // See #99
        dropAllUses(blk);

        // we also must drop refrences to instructions that are in
        // this block (or we would need to delete the blocks in
        // post-dominator order), see #101
        for (llvm::Instruction &Inst : *blk)
            dropAllUses(&Inst);

        // finally, erase the block per se
        blk->eraseFromParent();
        return true;
    }